

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_slab.c
# Opt level: O0

void ngx_slab_free_locked(ngx_slab_pool_t *pool,void *p)

{
  ngx_slab_page_t *page_00;
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong *puVar4;
  sbyte sVar5;
  ngx_slab_page_t *page;
  ngx_slab_page_t *slots;
  ngx_uint_t map;
  ngx_uint_t shift;
  ngx_uint_t slot;
  ngx_uint_t type;
  ngx_uint_t n;
  ngx_uint_t i;
  uintptr_t *bitmap;
  uintptr_t m;
  uintptr_t slab;
  size_t size;
  void *p_local;
  ngx_slab_pool_t *pool_local;
  
  if ((ngx_cycle->log->log_level & 0x20) != 0) {
    ngx_log_error_core(8,ngx_cycle->log,0,"slab free: %p",p);
  }
  if ((p < pool->start) || (pool->end < p)) {
    ngx_slab_error(pool,2,"ngx_slab_free(): outside of pool");
    return;
  }
  page_00 = pool->pages + ((long)p - (long)pool->start >> ((byte)ngx_pagesize_shift & 0x3f));
  uVar1 = page_00->slab;
  switch((uint)page_00->prev & 3) {
  case 0:
    if (((ulong)p & ngx_pagesize - 1) == 0) {
      if ((uVar1 & 0x8000000000000000) == 0) {
        ngx_slab_error(pool,2,"ngx_slab_free(): page is already free");
        return;
      }
      if (uVar1 == 0xffffffffffffffff) {
        ngx_slab_error(pool,2,"ngx_slab_free(): pointer to wrong page");
        return;
      }
      ngx_slab_free_pages(pool,pool->pages +
                               ((long)p - (long)pool->start >> ((byte)ngx_pagesize_shift & 0x3f)),
                          uVar1 & 0x7fffffffffffffff);
      return;
    }
    break;
  case 1:
    sVar5 = (sbyte)(uVar1 & 0xf);
    if (((ulong)p & (1L << sVar5) - 1U) == 0) {
      uVar3 = 1L << ((char)(((ulong)p & ngx_pagesize - 1) >> sVar5) + 0x20U & 0x3f);
      if ((uVar1 & uVar3) != 0) {
        shift = (uVar1 & 0xf) - pool->min_shift;
        if (page_00->next == (ngx_slab_page_t *)0x0) {
          page_00->next = *(ngx_slab_page_t **)((long)pool + shift * 0x18 + 0x98);
          *(ngx_slab_page_t **)((long)pool + shift * 0x18 + 0x98) = page_00;
          page_00->prev = (long)pool + shift * 0x18 + 0x90 | 1;
          page_00->next->prev = (ulong)page_00 | 1;
        }
        page_00->slab = (uVar3 ^ 0xffffffffffffffff) & page_00->slab;
        if ((page_00->slab & 0xffffffff00000000) == 0) {
          ngx_slab_free_pages(pool,page_00,1);
          pool->stats[shift].total = pool->stats[shift].total - (ngx_pagesize >> sVar5);
        }
LAB_0012af2c:
        pool->stats[shift].used = pool->stats[shift].used - 1;
        return;
      }
LAB_0012af64:
      ngx_slab_error(pool,2,"ngx_slab_free(): chunk is already free");
      return;
    }
    break;
  case 2:
    uVar3 = 1L << ((byte)(((ulong)p & ngx_pagesize - 1) >> ((byte)ngx_slab_exact_shift & 0x3f)) &
                  0x3f);
    if (((ulong)p & ngx_slab_exact_size - 1) == 0) {
      if ((uVar1 & uVar3) != 0) {
        shift = ngx_slab_exact_shift - pool->min_shift;
        if (uVar1 == 0xffffffffffffffff) {
          page_00->next = *(ngx_slab_page_t **)((long)pool + shift * 0x18 + 0x98);
          *(ngx_slab_page_t **)((long)pool + shift * 0x18 + 0x98) = page_00;
          page_00->prev = (long)pool + shift * 0x18 + 0x90 | 2;
          page_00->next->prev = (ulong)page_00 | 2;
        }
        page_00->slab = (uVar3 ^ 0xffffffffffffffff) & page_00->slab;
        if (page_00->slab == 0) {
          ngx_slab_free_pages(pool,page_00,1);
          pool->stats[shift].total = pool->stats[shift].total - 0x40;
        }
        goto LAB_0012af2c;
      }
      goto LAB_0012af64;
    }
    break;
  case 3:
    sVar5 = (sbyte)(uVar1 & 0xf);
    if (((ulong)p & (1L << sVar5) - 1U) == 0) {
      uVar2 = ((ulong)p & ngx_pagesize - 1) >> sVar5;
      uVar3 = 1L << ((byte)uVar2 & 0x3f);
      uVar2 = uVar2 >> 6;
      puVar4 = (ulong *)((ulong)p & (ngx_pagesize - 1 ^ 0xffffffffffffffff));
      if ((puVar4[uVar2] & uVar3) != 0) {
        shift = (uVar1 & 0xf) - pool->min_shift;
        if (page_00->next == (ngx_slab_page_t *)0x0) {
          page_00->next = *(ngx_slab_page_t **)((long)pool + shift * 0x18 + 0x98);
          *(ngx_slab_page_t **)((long)pool + shift * 0x18 + 0x98) = page_00;
          page_00->prev = (long)pool + shift * 0x18 + 0x90 | 3;
          page_00->next->prev = (ulong)page_00 | 3;
        }
        puVar4[uVar2] = (uVar3 ^ 0xffffffffffffffff) & puVar4[uVar2];
        type = (ngx_pagesize >> sVar5) / (ulong)(long)((1 << sVar5) << 3);
        if (type == 0) {
          type = 1;
        }
        if ((*puVar4 & ((1L << ((byte)type & 0x3f)) - 1U ^ 0xffffffffffffffff)) == 0) {
          for (n = 1; n < (ngx_pagesize >> sVar5) >> 6; n = n + 1) {
            if (puVar4[n] != 0) goto LAB_0012af2c;
          }
          ngx_slab_free_pages(pool,page_00,1);
          pool->stats[shift].total = pool->stats[shift].total - ((ngx_pagesize >> sVar5) - type);
        }
        goto LAB_0012af2c;
      }
      goto LAB_0012af64;
    }
    break;
  default:
    goto switchD_0012a970_default;
  }
  ngx_slab_error(pool,2,"ngx_slab_free(): pointer to wrong chunk");
switchD_0012a970_default:
  return;
}

Assistant:

void
ngx_slab_free_locked(ngx_slab_pool_t *pool, void *p)
{
    size_t            size;
    uintptr_t         slab, m, *bitmap;
    ngx_uint_t        i, n, type, slot, shift, map;
    ngx_slab_page_t  *slots, *page;

    ngx_log_debug1(NGX_LOG_DEBUG_ALLOC, ngx_cycle->log, 0, "slab free: %p", p);

    if ((u_char *) p < pool->start || (u_char *) p > pool->end) {
        ngx_slab_error(pool, NGX_LOG_ALERT, "ngx_slab_free(): outside of pool");
        goto fail;
    }

    n = ((u_char *) p - pool->start) >> ngx_pagesize_shift;
    page = &pool->pages[n];
    slab = page->slab;
    type = ngx_slab_page_type(page);

    switch (type) {

    case NGX_SLAB_SMALL:

        shift = slab & NGX_SLAB_SHIFT_MASK;
        size = (size_t) 1 << shift;

        if ((uintptr_t) p & (size - 1)) {
            goto wrong_chunk;
        }

        n = ((uintptr_t) p & (ngx_pagesize - 1)) >> shift;
        m = (uintptr_t) 1 << (n % (sizeof(uintptr_t) * 8));
        n /= sizeof(uintptr_t) * 8;
        bitmap = (uintptr_t *)
                             ((uintptr_t) p & ~((uintptr_t) ngx_pagesize - 1));

        if (bitmap[n] & m) {
            slot = shift - pool->min_shift;

            if (page->next == NULL) {
                slots = ngx_slab_slots(pool);

                page->next = slots[slot].next;
                slots[slot].next = page;

                page->prev = (uintptr_t) &slots[slot] | NGX_SLAB_SMALL;
                page->next->prev = (uintptr_t) page | NGX_SLAB_SMALL;
            }

            bitmap[n] &= ~m;

            n = (ngx_pagesize >> shift) / ((1 << shift) * 8);

            if (n == 0) {
                n = 1;
            }

            if (bitmap[0] & ~(((uintptr_t) 1 << n) - 1)) {
                goto done;
            }

            map = (ngx_pagesize >> shift) / (sizeof(uintptr_t) * 8);

            for (i = 1; i < map; i++) {
                if (bitmap[i]) {
                    goto done;
                }
            }

            ngx_slab_free_pages(pool, page, 1);

            pool->stats[slot].total -= (ngx_pagesize >> shift) - n;

            goto done;
        }

        goto chunk_already_free;

    case NGX_SLAB_EXACT:

        m = (uintptr_t) 1 <<
                (((uintptr_t) p & (ngx_pagesize - 1)) >> ngx_slab_exact_shift);
        size = ngx_slab_exact_size;

        if ((uintptr_t) p & (size - 1)) {
            goto wrong_chunk;
        }

        if (slab & m) {
            slot = ngx_slab_exact_shift - pool->min_shift;

            if (slab == NGX_SLAB_BUSY) {
                slots = ngx_slab_slots(pool);

                page->next = slots[slot].next;
                slots[slot].next = page;

                page->prev = (uintptr_t) &slots[slot] | NGX_SLAB_EXACT;
                page->next->prev = (uintptr_t) page | NGX_SLAB_EXACT;
            }

            page->slab &= ~m;

            if (page->slab) {
                goto done;
            }

            ngx_slab_free_pages(pool, page, 1);

            pool->stats[slot].total -= sizeof(uintptr_t) * 8;

            goto done;
        }

        goto chunk_already_free;

    case NGX_SLAB_BIG:

        shift = slab & NGX_SLAB_SHIFT_MASK;
        size = (size_t) 1 << shift;

        if ((uintptr_t) p & (size - 1)) {
            goto wrong_chunk;
        }

        m = (uintptr_t) 1 << ((((uintptr_t) p & (ngx_pagesize - 1)) >> shift)
                              + NGX_SLAB_MAP_SHIFT);

        if (slab & m) {
            slot = shift - pool->min_shift;

            if (page->next == NULL) {
                slots = ngx_slab_slots(pool);

                page->next = slots[slot].next;
                slots[slot].next = page;

                page->prev = (uintptr_t) &slots[slot] | NGX_SLAB_BIG;
                page->next->prev = (uintptr_t) page | NGX_SLAB_BIG;
            }

            page->slab &= ~m;

            if (page->slab & NGX_SLAB_MAP_MASK) {
                goto done;
            }

            ngx_slab_free_pages(pool, page, 1);

            pool->stats[slot].total -= ngx_pagesize >> shift;

            goto done;
        }

        goto chunk_already_free;

    case NGX_SLAB_PAGE:

        if ((uintptr_t) p & (ngx_pagesize - 1)) {
            goto wrong_chunk;
        }

        if (!(slab & NGX_SLAB_PAGE_START)) {
            ngx_slab_error(pool, NGX_LOG_ALERT,
                           "ngx_slab_free(): page is already free");
            goto fail;
        }

        if (slab == NGX_SLAB_PAGE_BUSY) {
            ngx_slab_error(pool, NGX_LOG_ALERT,
                           "ngx_slab_free(): pointer to wrong page");
            goto fail;
        }

        n = ((u_char *) p - pool->start) >> ngx_pagesize_shift;
        size = slab & ~NGX_SLAB_PAGE_START;

        ngx_slab_free_pages(pool, &pool->pages[n], size);

        ngx_slab_junk(p, size << ngx_pagesize_shift);

        return;
    }

    /* not reached */

    return;

done:

    pool->stats[slot].used--;

    ngx_slab_junk(p, size);

    return;

wrong_chunk:

    ngx_slab_error(pool, NGX_LOG_ALERT,
                   "ngx_slab_free(): pointer to wrong chunk");

    goto fail;

chunk_already_free:

    ngx_slab_error(pool, NGX_LOG_ALERT,
                   "ngx_slab_free(): chunk is already free");

fail:

    return;
}